

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

double basym(double *a,double *b,double *lambda,double *eps)

{
  double dVar1;
  int iVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  int local_50;
  
  basym::basym = 0.0;
  dVar22 = *a;
  dVar1 = *b;
  if (dVar22 < dVar1) {
    basym::h = dVar22 / dVar1;
  }
  else {
    basym::h = dVar1 / dVar22;
  }
  dVar19 = dVar22;
  if (dVar22 >= dVar1) {
    dVar19 = dVar1;
  }
  basym::r0 = 1.0 / (basym::h + 1.0);
  basym::r1 = (dVar1 - dVar22) /
              (double)(~-(ulong)(dVar22 < dVar1) & (ulong)dVar22 |
                      -(ulong)(dVar22 < dVar1) & (ulong)dVar1);
  dVar19 = (basym::h + 1.0) * dVar19;
  if (dVar19 < 0.0) {
    dVar19 = sqrt(dVar19);
  }
  else {
    dVar19 = SQRT(dVar19);
  }
  basym::w0 = 1.0 / dVar19;
  basym::T1 = -*lambda / *a;
  basym::T2 = *lambda / *b;
  dVar22 = *a;
  dVar19 = rlog1(&basym::T1);
  dVar1 = *b;
  dVar20 = rlog1(&basym::T2);
  basym::f = dVar20 * dVar1 + dVar19 * dVar22;
  basym::t = exp(-basym::f);
  if ((basym::t != 0.0) || (NAN(basym::t))) {
    if (basym::f < 0.0) {
      basym::z0 = sqrt(basym::f);
    }
    else {
      basym::z0 = SQRT(basym::f);
    }
    basym::z = (basym::z0 / 0.353553390593274) * 0.5;
    basym::z2 = basym::f + basym::f;
    basym::a0[0] = basym::r1 * 0.6666666666666666;
    basym::d[0] = basym::a0[0] * 0.5;
    basym::c[0] = -basym::d[0];
    dVar21 = erfc1(&basym::K3,&basym::z0);
    dVar3 = basym::z2;
    dVar20 = basym::w0;
    dVar19 = basym::h;
    dVar21 = dVar21 * 0.4431134627263801;
    basym::sum = basym::d[0] * basym::w0 * 0.353553390593274 + dVar21;
    dVar23 = basym::h * basym::h;
    dVar28 = basym::r0 + basym::r0;
    dVar29 = basym::r1 + basym::r1;
    dVar1 = *eps;
    dVar22 = 0.353553390593274;
    lVar14 = 3;
    lVar5 = 5;
    lVar13 = 0;
    dVar36 = 1.0;
    dVar37 = 1.0;
    uVar6 = 2;
    dVar24 = basym::w0;
    dVar31 = basym::z;
    dVar32 = basym::z2;
    do {
      dVar36 = dVar36 * dVar23;
      iVar2 = (int)uVar6;
      local_50 = iVar2 + -1;
      dVar37 = dVar37 + dVar36;
      auVar27._0_8_ = (dVar19 * dVar36 + 1.0) * dVar28;
      auVar27._8_8_ = dVar37 * dVar29;
      auVar34._0_8_ = uVar6 + 2 & 0xffffffff;
      auVar34._8_4_ = iVar2 + 3;
      auVar34._12_4_ = 0;
      auVar35._0_8_ = SUB168(auVar34 | _DAT_00112d10,0) - (double)DAT_00112d10;
      auVar35._8_8_ = SUB168(auVar34 | _DAT_00112d10,8) - DAT_00112d10._8_8_;
      auVar27 = divpd(auVar27,auVar35);
      *(undefined1 (*) [16])(&basym::z2 + uVar6) = auVar27;
      dVar26 = basym::a0[0];
      uVar7 = uVar6;
      lVar12 = lVar13;
      lVar15 = lVar14;
      do {
        dVar33 = (double)(uVar7 + 1 & 0xffffffff);
        dVar30 = dVar33 * -0.5;
        basym::b0[0] = dVar30 * dVar26;
        lVar16 = 2;
        lVar8 = 1;
        pdVar11 = basym::b0;
        do {
          dVar25 = 0.0;
          iVar4 = 1;
          pdVar9 = basym::a0;
          pdVar10 = pdVar11;
          lVar17 = lVar8;
          do {
            dVar25 = dVar25 + ((double)iVar4 * dVar30 - (double)(int)lVar17) * *pdVar9 * *pdVar10;
            pdVar10 = pdVar10 + -1;
            pdVar9 = pdVar9 + 1;
            iVar4 = iVar4 + 1;
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
          (&DAT_00116358)[lVar16] = (&basym::z2)[lVar16] * dVar30 + dVar25 / (double)(int)lVar16;
          lVar16 = lVar16 + 1;
          pdVar11 = pdVar11 + 1;
          lVar8 = lVar8 + 1;
        } while (lVar16 != lVar15);
        dVar33 = (double)(&DAT_00116358)[uVar7] / dVar33;
        pdVar11 = basym::c;
        *(double *)(uVar7 * 8 + 0x116408) = dVar33;
        dVar30 = 0.0;
        lVar8 = lVar12;
        do {
          dVar30 = dVar30 + *(double *)((long)basym::d + lVar8) * *pdVar11;
          lVar8 = lVar8 + -8;
          pdVar11 = pdVar11 + 1;
        } while (lVar8 != -8);
        (&DAT_001164b8)[uVar7] = -(dVar33 + dVar30);
        lVar15 = lVar15 + 1;
        lVar12 = lVar12 + 8;
        uVar7 = uVar7 + 1;
      } while (lVar15 != lVar5);
      dVar21 = dVar31 * 0.353553390593274 + dVar21 * (double)local_50;
      dVar22 = dVar32 * 0.353553390593274 + dVar22 * (double)iVar2;
      dVar26 = dVar24 * dVar20;
      dVar24 = dVar20 * dVar26;
      dVar26 = dVar26 * (double)(&DAT_001164b8)[uVar6] * dVar21;
      dVar33 = dVar24 * basym::d[uVar6] * dVar22;
      basym::sum = basym::sum + dVar33 + dVar26;
      if (ABS(dVar33) + ABS(dVar26) <= dVar1 * basym::sum) break;
      dVar31 = dVar31 * dVar3;
      dVar32 = dVar32 * dVar3;
      lVar14 = lVar14 + 2;
      lVar5 = lVar5 + 2;
      lVar13 = lVar13 + 0x10;
      bVar18 = uVar6 < 0x13;
      uVar6 = uVar6 + 2;
    } while (bVar18);
    dVar22 = bcorr(a,b);
    dVar22 = exp(-dVar22);
    basym::basym = basym::t * 1.12837916709551 * dVar22 * basym::sum;
  }
  return basym::basym;
}

Assistant:

double basym(double *a,double *b,double *lambda,double *eps)
/*
-----------------------------------------------------------------------
     ASYMPTOTIC EXPANSION FOR IX(A,B) FOR LARGE A AND B.
     LAMBDA = (A + B)*Y - B  AND EPS IS THE TOLERANCE USED.
     IT IS ASSUMED THAT LAMBDA IS NONNEGATIVE AND THAT
     A AND B ARE GREATER THAN OR EQUAL TO 15.
-----------------------------------------------------------------------
*/
{
static double e0 = 1.12837916709551e0;
static double e1 = .353553390593274e0;
static int num = 20;
/*
------------------------
     ****** NUM IS THE MAXIMUM VALUE THAT N CAN TAKE IN THE DO LOOP
            ENDING AT STATEMENT 50. IT IS REQUIRED THAT NUM BE EVEN.
            THE ARRAYS A0, B0, C, D HAVE DIMENSION NUM + 1.
------------------------
     E0 = 2/SQRT(PI)
     E1 = 2**(-3/2)
------------------------
*/
static int K3 = 1;
static double basym,bsum,dsum,f,h,h2,hn,j0,j1,r,r0,r1,s,sum,t,t0,t1,u,w,w0,z,z0,
    z2,zn,znm1;
static int i,im1,imj,j,m,mm1,mmj,n,np1;
static double a0[21],b0[21],c[21],d[21],T1,T2;
/*
     ..
     .. Executable Statements ..
*/
    basym = 0.0e0;
    if(*a >= *b) goto S10;
    h = *a/ *b;
    r0 = 1.0e0/(1.0e0+h);
    r1 = (*b-*a)/ *b;
    w0 = 1.0e0/sqrt(*a*(1.0e0+h));
    goto S20;
S10:
    h = *b/ *a;
    r0 = 1.0e0/(1.0e0+h);
    r1 = (*b-*a)/ *a;
    w0 = 1.0e0/sqrt(*b*(1.0e0+h));
S20:
    T1 = -(*lambda/ *a);
    T2 = *lambda/ *b;
    f = *a*rlog1(&T1)+*b*rlog1(&T2);
    t = exp(-f);
    if(t == 0.0e0) return basym;
    z0 = sqrt(f);
    z = 0.5e0*(z0/e1);
    z2 = f+f;
    a0[0] = 2.0e0/3.0e0*r1;
    c[0] = -(0.5e0*a0[0]);
    d[0] = -c[0];
    j0 = 0.5e0/e0*erfc1(&K3,&z0);
    j1 = e1;
    sum = j0+d[0]*w0*j1;
    s = 1.0e0;
    h2 = h*h;
    hn = 1.0e0;
    w = w0;
    znm1 = z;
    zn = z2;
    for(n=2; n<=num; n+=2) {
        hn = h2*hn;
        a0[n-1] = 2.0e0*r0*(1.0e0+h*hn)/((double)n+2.0e0);
        np1 = n+1;
        s += hn;
        a0[np1-1] = 2.0e0*r1*s/((double)n+3.0e0);
        for(i=n; i<=np1; i++) {
            r = -(0.5e0*((double)i+1.0e0));
            b0[0] = r*a0[0];
            for(m=2; m<=i; m++) {
                bsum = 0.0e0;
                mm1 = m-1;
                for(j=1; j<=mm1; j++) {
                    mmj = m-j;
                    bsum += (((double)j*r-(double)mmj)*a0[j-1]*b0[mmj-1]);
                }
                b0[m-1] = r*a0[m-1]+bsum/(double)m;
            }
            c[i-1] = b0[i-1]/((double)i+1.0e0);
            dsum = 0.0e0;
            im1 = i-1;
            for(j=1; j<=im1; j++) {
                imj = i-j;
                dsum += (d[imj-1]*c[j-1]);
            }
            d[i-1] = -(dsum+c[i-1]);
        }
        j0 = e1*znm1+((double)n-1.0e0)*j0;
        j1 = e1*zn+(double)n*j1;
        znm1 = z2*znm1;
        zn = z2*zn;
        w = w0*w;
        t0 = d[n-1]*w*j0;
        w = w0*w;
        t1 = d[np1-1]*w*j1;
        sum += (t0+t1);
        if(fabs(t0)+fabs(t1) <= *eps*sum) goto S80;
    }
S80:
    u = exp(-bcorr(a,b));
    basym = e0*t*u*sum;
    return basym;
}